

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

FILE * open_file(char *name,char *mode)

{
  size_t sVar1;
  int local_12c;
  char local_128 [4];
  int i;
  char testname [256];
  FILE *fileptr;
  char *mode_local;
  char *name_local;
  
  testname._248_8_ = fopen(name,mode);
  name_local = (char *)testname._248_8_;
  if ((FILE *)testname._248_8_ == (FILE *)0x0) {
    for (local_12c = 0; local_12c < incpathCount; local_12c = local_12c + 1) {
      sVar1 = strlen(incpath + str_offset[local_12c]);
      if (sVar1 != 0) {
        strcpy(local_128,incpath + str_offset[local_12c]);
        strcat(local_128,"/");
        strcat(local_128,name);
        testname._248_8_ = fopen(local_128,mode);
        if ((FILE *)testname._248_8_ != (FILE *)0x0) break;
      }
    }
    name_local = (char *)testname._248_8_;
  }
  return (FILE *)name_local;
}

Assistant:

FILE *
open_file(char *name, char *mode)
{
	FILE 	*fileptr;
	char	testname[256];
	int	i;

	fileptr = fopen(name, mode);
	if (fileptr != NULL) return(fileptr);

	for (i = 0; i < incpathCount; ++i) {
		if (strlen(incpath+str_offset[i])) {
			strcpy(testname, incpath+str_offset[i]);
			strcat(testname, PATH_SEPARATOR_STRING);
			strcat(testname, name);
		
			fileptr = fopen(testname, mode);
			if (fileptr != NULL) break;
		}
	}

	return (fileptr);
}